

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O1

void __thiscall ConductorBRDF::ConductorBRDF(ConductorBRDF *this,string *name)

{
  size_t __n;
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  bool bVar4;
  long lVar5;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x16c850;
  *(undefined8 *)&this->field_0x28 = 0x16c898;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0x16c870;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  (this->k).y = 0.0;
  (this->k).z = 0.0;
  *(undefined4 *)&this->field_0x30 = 3;
  lVar5 = 0;
  bVar4 = false;
  do {
    __n = *(size_t *)((long)&complexIorList[0].name._M_string_length + lVar5);
    if (__n == name->_M_string_length) {
      if (__n != 0) {
        iVar2 = bcmp(*(void **)((long)&complexIorList[0].name._M_dataplus._M_p + lVar5),
                     (name->_M_dataplus)._M_p,__n);
        if (iVar2 != 0) goto LAB_0013bd5b;
      }
      *(undefined4 *)&this->field_0x18 = *(undefined4 *)((long)&complexIorList[0].eta.z + lVar5);
      *(undefined8 *)&(this->super_BRDF).field_0x10 =
           *(undefined8 *)((long)&complexIorList[0].eta.x + lVar5);
      (this->k).z = *(float *)((long)&complexIorList[0].k.z + lVar5);
      uVar1 = *(undefined8 *)((long)&complexIorList[0].k.x + lVar5);
      (this->k).x = (float)(int)uVar1;
      (this->k).y = (float)(int)((ulong)uVar1 >> 0x20);
      bVar4 = true;
    }
LAB_0013bd5b:
    lVar5 = lVar5 + 0x38;
    if (lVar5 == 0x8c0) {
      if (bVar4) {
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "conductor material not found";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  } while( true );
}

Assistant:

ConductorBRDF(std::string name)
	{
		flags = Type(DIRAC | REFLECT);
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
	}